

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_prefix_coding.cpp
# Opt level: O0

bool crnlib::prefix_coding::generate_codes(uint num_syms,uint8 *pCodesizes,uint16 *pCodes)

{
  uint uVar1;
  uint uVar2;
  uint local_c8;
  uint c_1;
  uint i_3;
  uint i_2;
  uint t;
  uint i_1;
  uint next_code [17];
  uint code;
  uint c;
  uint i;
  uint num_codes [17];
  uint16 *pCodes_local;
  uint8 *pCodesizes_local;
  uint num_syms_local;
  
  unique0x10000169 = pCodes;
  utils::zero_object<unsigned_int[17]>((uint (*) [17])&c);
  for (code = 0; code < num_syms; code = code + 1) {
    next_code[0x10] = (uint)pCodesizes[code];
    if (next_code[0x10] != 0) {
      (&c)[next_code[0x10]] = (&c)[next_code[0x10]] + 1;
    }
  }
  next_code[0xf] = 0;
  for (i_2 = 1; i_2 < 0x11; i_2 = i_2 + 1) {
    (&t)[i_2] = next_code[0xf];
    next_code[0xf] = (next_code[0xf] + (&c)[i_2]) * 2;
  }
  if (next_code[0xf] != 0x20000) {
    i_3 = 0;
    for (c_1 = 1; c_1 < 0x11; c_1 = c_1 + 1) {
      i_3 = (&c)[c_1] + i_3;
      if (1 < i_3) {
        return false;
      }
    }
  }
  for (local_c8 = 0; local_c8 < num_syms; local_c8 = local_c8 + 1) {
    uVar2 = (uint)pCodesizes[local_c8];
    if (uVar2 != 0) {
      uVar1 = (&t)[uVar2];
      (&t)[uVar2] = uVar1 + 1;
      stack0xffffffffffffffe0[local_c8] = (uint16)uVar1;
    }
  }
  return true;
}

Assistant:

bool generate_codes(uint num_syms, const uint8* pCodesizes, uint16* pCodes)
        {
            uint num_codes[cMaxExpectedCodeSize + 1];
            utils::zero_object(num_codes);

            for (uint i = 0; i < num_syms; i++)
            {
                uint c = pCodesizes[i];
                if (c)
                {
                    CRNLIB_ASSERT(c <= cMaxExpectedCodeSize);
                    num_codes[c]++;
                }
            }

            uint code = 0;

            uint next_code[cMaxExpectedCodeSize + 1];
            next_code[0] = 0;

            for (uint i = 1; i <= cMaxExpectedCodeSize; i++)
            {
                next_code[i] = code;

                code = (code + num_codes[i]) << 1;
            }

            if (code != (1 << (cMaxExpectedCodeSize + 1)))
            {
                uint t = 0;
                for (uint i = 1; i <= cMaxExpectedCodeSize; i++)
                {
                    t += num_codes[i];
                    if (t > 1)
                    {
                        return false;
                    }
                }
            }

            for (uint i = 0; i < num_syms; i++)
            {
                uint c = pCodesizes[i];
                if (c)
                {
                    CRNLIB_ASSERT(next_code[c] <= cUINT16_MAX);
                    pCodes[i] = static_cast<uint16>(next_code[c]++);

                    CRNLIB_ASSERT(math::total_bits(pCodes[i]) <= pCodesizes[i]);
                }
            }

            return true;
        }